

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5ExprNodeNext_TERM(Fts5Expr *pExpr,Fts5ExprNode *pNode,int bFromValid,i64 iFrom)

{
  Fts5IndexIter *pFVar1;
  Fts5ExprPhrase *pFVar2;
  int iVar3;
  uint uVar4;
  
  pFVar1 = pNode->pNear->apPhrase[0]->aTerm[0].pIter;
  if (bFromValid == 0) {
    iVar3 = sqlite3Fts5IterNext(pFVar1);
  }
  else {
    iVar3 = sqlite3Fts5IterNextFrom(pFVar1,iFrom);
  }
  if ((iVar3 == 0) && (pFVar1->bEof == '\0')) {
    pFVar2 = pNode->pNear->apPhrase[0];
    pFVar1 = pFVar2->aTerm[0].pIter;
    iVar3 = pFVar1->nData;
    (pFVar2->poslist).n = iVar3;
    if (pExpr->pConfig->eDetail == 0) {
      (pFVar2->poslist).p = pFVar1->pData;
    }
    pNode->iRowid = pFVar1->iRowid;
    uVar4 = (uint)(iVar3 == 0);
    iVar3 = 0;
  }
  else {
    pNode->bEof = 1;
    uVar4 = 0;
  }
  pNode->bNomatch = uVar4;
  return iVar3;
}

Assistant:

static int fts5ExprNodeNext_TERM(
  Fts5Expr *pExpr,
  Fts5ExprNode *pNode,
  int bFromValid,
  i64 iFrom
){
  int rc;
  Fts5IndexIter *pIter = pNode->pNear->apPhrase[0]->aTerm[0].pIter;

  assert( pNode->bEof==0 );
  if( bFromValid ){
    rc = sqlite3Fts5IterNextFrom(pIter, iFrom);
  }else{
    rc = sqlite3Fts5IterNext(pIter);
  }
  if( rc==SQLITE_OK && sqlite3Fts5IterEof(pIter)==0 ){
    rc = fts5ExprNodeTest_TERM(pExpr, pNode);
  }else{
    pNode->bEof = 1;
    pNode->bNomatch = 0;
  }
  return rc;
}